

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Maybe<unsigned_char> __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_char>::tryAllocate
          (HoleSet<unsigned_char> *this,uchar lgSize)

{
  uchar uVar1;
  uchar result;
  undefined8 in_RAX;
  byte in_DL;
  undefined7 in_register_00000031;
  long lVar2;
  ulong uVar3;
  uchar local_22;
  uchar local_21;
  
  _local_22 = (undefined2)((ulong)in_RAX >> 0x30);
  lVar2 = CONCAT71(in_register_00000031,lgSize);
  if (in_DL < 6) {
    uVar3 = (ulong)in_DL;
    uVar1 = *(uchar *)(lVar2 + uVar3);
    if (uVar1 != '\0') {
      *(undefined1 *)(lVar2 + uVar3) = 0;
      this->holes[0] = '\x01';
      this->holes[1] = uVar1;
      goto LAB_00175b01;
    }
    tryAllocate((HoleSet<unsigned_char> *)&local_22,lgSize);
    if (local_22 == '\x01') {
      *(uchar *)(lVar2 + uVar3) = local_21 * '\x02' + '\x01';
      this->holes[0] = '\x01';
      this->holes[1] = local_21 * '\x02';
      goto LAB_00175b01;
    }
  }
  this->holes[0] = '\0';
LAB_00175b01:
  return (Maybe<unsigned_char>)SUB82(this,0);
}

Assistant:

kj::Maybe<UIntType> tryAllocate(UIntType lgSize) {
      // Try to find space for a field of size 2^lgSize within the set of holes.  If found,
      // remove it from the holes, and return its offset (as a multiple of its size).  If there
      // is no such space, returns zero (no hole can be at offset zero, as explained above).

      if (lgSize >= kj::size(holes)) {
        return kj::none;
      } else if (holes[lgSize] != 0) {
        UIntType result = holes[lgSize];
        holes[lgSize] = 0;
        return result;
      } else {
        KJ_IF_SOME(next, tryAllocate(lgSize + 1)) {
          UIntType result = next * 2;
          holes[lgSize] = result + 1;
          return result;
        } else {
          return kj::none;
        }
      }